

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_normalize_30
               (secp256k1_modinv32_signed30 *r,int32_t sign,secp256k1_modinv32_modinfo *modinfo)

{
  int32_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  undefined8 uStack_80;
  int32_t cond_add;
  int32_t cond_negate;
  
  iVar31 = r->v[0];
  iVar2 = r->v[1];
  iVar3 = r->v[2];
  iVar4 = r->v[3];
  iVar5 = r->v[4];
  iVar6 = r->v[5];
  iVar7 = r->v[6];
  iVar8 = r->v[7];
  iVar9 = r->v[8];
  lVar14 = 0;
  do {
    if (lVar14 == 9) {
      iVar12 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,-2);
      if (iVar12 < 1) {
        pcVar28 = 
        "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0";
        uStack_80 = 0x4c;
      }
      else {
        iVar12 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,1);
        if (iVar12 < 0) {
          uVar13 = iVar9 >> 0x1f;
          uVar16 = (modinfo->modulus).v[0];
          uVar18 = (modinfo->modulus).v[1];
          uVar19 = (modinfo->modulus).v[2];
          uVar21 = (modinfo->modulus).v[3];
          uVar24 = (modinfo->modulus).v[4];
          uVar27 = (modinfo->modulus).v[5];
          uVar30 = (modinfo->modulus).v[6];
          uVar10 = (modinfo->modulus).v[7];
          uVar25 = sign >> 0x1f;
          uVar11 = (modinfo->modulus).v[8];
          uVar29 = ((uVar13 & uVar16) + iVar31 ^ uVar25) - uVar25;
          uVar26 = ((int)uVar29 >> 0x1e) + (((uVar13 & uVar18) + iVar2 ^ uVar25) - uVar25);
          uVar23 = ((int)uVar26 >> 0x1e) + (((uVar13 & uVar19) + iVar3 ^ uVar25) - uVar25);
          uVar32 = ((int)uVar23 >> 0x1e) + (((uVar13 & uVar21) + iVar4 ^ uVar25) - uVar25);
          uVar17 = ((int)uVar32 >> 0x1e) + (((uVar13 & uVar24) + iVar5 ^ uVar25) - uVar25);
          uVar15 = ((int)uVar17 >> 0x1e) + (((uVar13 & uVar27) + iVar6 ^ uVar25) - uVar25);
          uVar22 = ((int)uVar15 >> 0x1e) + (((uVar13 & uVar30) + iVar7 ^ uVar25) - uVar25);
          uVar20 = ((int)uVar22 >> 0x1e) + (((uVar13 & uVar10) + iVar8 ^ uVar25) - uVar25);
          iVar31 = ((int)uVar20 >> 0x1e) + (((uVar13 & uVar11) + iVar9 ^ uVar25) - uVar25);
          uVar13 = iVar31 >> 0x1f;
          uVar25 = (uVar16 & uVar13) + (uVar29 & 0x3fffffff);
          uVar16 = ((int)uVar25 >> 0x1e) + (uVar18 & uVar13) + (uVar26 & 0x3fffffff);
          uVar18 = ((int)uVar16 >> 0x1e) + (uVar19 & uVar13) + (uVar23 & 0x3fffffff);
          uVar23 = ((int)uVar18 >> 0x1e) + (uVar21 & uVar13) + (uVar32 & 0x3fffffff);
          uVar24 = ((int)uVar23 >> 0x1e) + (uVar24 & uVar13) + (uVar17 & 0x3fffffff);
          uVar27 = ((int)uVar24 >> 0x1e) + (uVar27 & uVar13) + (uVar15 & 0x3fffffff);
          uVar30 = ((int)uVar27 >> 0x1e) + (uVar30 & uVar13) + (uVar22 & 0x3fffffff);
          uVar19 = ((int)uVar30 >> 0x1e) + (uVar10 & uVar13) + (uVar20 & 0x3fffffff);
          uVar21 = ((int)uVar19 >> 0x1e) + (uVar11 & uVar13) + iVar31;
          r->v[0] = uVar25 & 0x3fffffff;
          r->v[1] = uVar16 & 0x3fffffff;
          r->v[2] = uVar18 & 0x3fffffff;
          r->v[3] = uVar23 & 0x3fffffff;
          r->v[4] = uVar24 & 0x3fffffff;
          r->v[5] = uVar27 & 0x3fffffff;
          r->v[6] = uVar30 & 0x3fffffff;
          r->v[7] = uVar19 & 0x3fffffff;
          r->v[8] = uVar21;
          if (uVar21 < 0x40000000) {
            iVar31 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,0);
            if (iVar31 < 0) {
              pcVar28 = 
              "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0"
              ;
              uStack_80 = 0x9c;
            }
            else {
              iVar31 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,1);
              if (iVar31 < 0) {
                return;
              }
              pcVar28 = 
              "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0"
              ;
              uStack_80 = 0x9d;
            }
          }
          else {
            pcVar28 = "test condition failed: r8 >> 30 == 0";
            uStack_80 = 0x9b;
          }
        }
        else {
          pcVar28 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0";
          uStack_80 = 0x4d;
        }
      }
      goto LAB_001353c6;
    }
    piVar1 = r->v + lVar14;
    if (*piVar1 < -0x3fffffff) {
      pcVar28 = "test condition failed: r->v[i] >= -M30";
      uStack_80 = 0x49;
      goto LAB_001353c6;
    }
    lVar14 = lVar14 + 1;
  } while (*piVar1 < 0x40000000);
  pcVar28 = "test condition failed: r->v[i] <= M30";
  uStack_80 = 0x4a;
LAB_001353c6:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,uStack_80,pcVar28);
  abort();
}

Assistant:

static void secp256k1_modinv32_normalize_30(secp256k1_modinv32_signed30 *r, int32_t sign, const secp256k1_modinv32_modinfo *modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int32_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4],
            r5 = r->v[5], r6 = r->v[6], r7 = r->v[7], r8 = r->v[8];
    volatile int32_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^30,2^30). */
    int i;
    for (i = 0; i < 9; ++i) {
        VERIFY_CHECK(r->v[i] >= -M30);
        VERIFY_CHECK(r->v[i] <= M30);
    }
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^30,2^30), this cannot overflow an int32_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    cond_negate = sign >> 31;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    r5 = (r5 ^ cond_negate) - cond_negate;
    r6 = (r6 ^ cond_negate) - cond_negate;
    r7 = (r7 ^ cond_negate) - cond_negate;
    r8 = (r8 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^30,2^30). */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    /* In a second step add the modulus again if the result is still negative, bringing r to range
     * [0,modulus). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;
    r->v[5] = r5;
    r->v[6] = r6;
    r->v[7] = r7;
    r->v[8] = r8;

    VERIFY_CHECK(r0 >> 30 == 0);
    VERIFY_CHECK(r1 >> 30 == 0);
    VERIFY_CHECK(r2 >> 30 == 0);
    VERIFY_CHECK(r3 >> 30 == 0);
    VERIFY_CHECK(r4 >> 30 == 0);
    VERIFY_CHECK(r5 >> 30 == 0);
    VERIFY_CHECK(r6 >> 30 == 0);
    VERIFY_CHECK(r7 >> 30 == 0);
    VERIFY_CHECK(r8 >> 30 == 0);
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
}